

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectFile.cpp
# Opt level: O0

bool __thiscall ObjectFile::deleteAttribute(ObjectFile *this,CK_ATTRIBUTE_TYPE type)

{
  bool bVar1;
  undefined8 uVar2;
  mapped_type *ppOVar3;
  key_type *in_RSI;
  map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
  *in_RDI;
  MutexLocker lock;
  bool in_stack_0000009f;
  ObjectFile *in_stack_000000a0;
  Mutex *in_stack_ffffffffffffffa8;
  mapped_type __x;
  MutexLocker *in_stack_ffffffffffffffb0;
  map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
  *this_00;
  undefined1 local_1;
  
  if ((in_RDI[2]._M_t._M_impl.super__Rb_tree_header._M_header._M_color & _S_black) == _S_red) {
    uVar2 = std::__cxx11::string::c_str();
    softHSMLog(7,"deleteAttribute",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/ObjectFile.cpp"
               ,0xf1,"Cannot update invalid object %s",uVar2);
    local_1 = _S_red;
  }
  else {
    this_00 = in_RDI;
    MutexLocker::MutexLocker(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    ppOVar3 = std::
              map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
              ::operator[](this_00,in_RSI);
    if (*ppOVar3 == (mapped_type)0x0) {
      uVar2 = std::__cxx11::string::c_str();
      softHSMLog(7,"deleteAttribute",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/ObjectFile.cpp"
                 ,0xfb,"Cannot delete attribute that doesn\'t exist in object %s",uVar2);
      local_1 = _S_red;
      bVar1 = true;
    }
    else {
      in_stack_ffffffffffffffb0 =
           (MutexLocker *)
           std::
           map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
           ::operator[](this_00,in_RSI);
      __x = *(mapped_type *)&((_Rep_type *)&in_stack_ffffffffffffffb0->_vptr_MutexLocker)->_M_impl;
      if (__x != (mapped_type)0x0) {
        (*__x->_vptr_OSAttribute[1])();
      }
      std::
      map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
      ::erase((map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
               *)in_stack_ffffffffffffffb0,(key_type *)__x);
      bVar1 = false;
    }
    MutexLocker::~MutexLocker(in_stack_ffffffffffffffb0);
    if (!bVar1) {
      store(in_stack_000000a0,in_stack_0000009f);
      local_1 = (char)in_RDI[2]._M_t._M_impl.super__Rb_tree_header._M_header._M_color & _S_black;
    }
  }
  return (bool)(local_1 & _S_black);
}

Assistant:

bool ObjectFile::deleteAttribute(CK_ATTRIBUTE_TYPE type)
{
	if (!valid)
	{
		DEBUG_MSG("Cannot update invalid object %s", path.c_str());

		return false;
	}

	{
		MutexLocker lock(objectMutex);

		if (attributes[type] == NULL)
		{
			DEBUG_MSG("Cannot delete attribute that doesn't exist in object %s", path.c_str());

			return false;
		}

		delete attributes[type];
		attributes.erase(type);
	}

	store();

	return valid;
}